

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThread.cpp
# Opt level: O3

Value __thiscall xmrig::CudaThread::toJSON(CudaThread *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  long in_RDX;
  undefined8 extraout_RDX;
  Value VVar1;
  Data local_98;
  Data local_88;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  this->m_blocks = 0;
  this->m_threads = 0;
  this->m_affinity = 0;
  *(undefined2 *)((long)&this->m_affinity + 6) = 3;
  local_98._4_1_ = '\0';
  local_98._5_1_ = '\0';
  local_98._6_1_ = '\0';
  local_98._7_1_ = '\0';
  local_98._0_4_ = *(uint *)&doc->allocator_;
  local_88.s.str = (Ch *)0x40500000018c158;
  local_88.n = (Number)0x5;
  local_98.s.str = (Ch *)((ulong)(-1 < (int)*(uint *)&doc->allocator_) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,allocator);
  local_40.s = "threads";
  local_40.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,&local_40,
                 (doc->
                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ).data_.s.hashcode,allocator);
  local_50.s = "blocks";
  local_50.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,&local_50,
                 (doc->
                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ).data_.s.length,allocator);
  local_60.s = "bfactor";
  local_60.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,&local_60,*(int *)((long)&doc->allocator_ + 4),allocator);
  local_70.s = "bsleep";
  local_70.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,&local_70,*(int *)&doc->ownAllocator_,allocator);
  local_98.s.str = (Ch *)0x40500000018826f;
  local_98.n = (Number)0x8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_98.s,
                  (long)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.str,allocator);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::CudaThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);

    out.AddMember(StringRef(kIndex),        index(), allocator);
    out.AddMember(StringRef(kThreads),      threads(), allocator);
    out.AddMember(StringRef(kBlocks),       blocks(), allocator);
    out.AddMember(StringRef(kBFactor),      bfactor(), allocator);
    out.AddMember(StringRef(kBSleep),       bsleep(), allocator);
    out.AddMember(StringRef(kAffinity),     affinity(), allocator);

    return out;
}